

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O1

bool __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>
::
_multiply_target_and_add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>>
          (Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>
           *this,Field_element *val,
          Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
          *column)

{
  ID_index IVar1;
  undefined8 *puVar2;
  pointer ppEVar3;
  pointer ppEVar4;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
  *pEVar5;
  bool bVar6;
  undefined4 *puVar7;
  Column_support *__range2;
  undefined8 *puVar8;
  uint uVar9;
  pointer ppEVar10;
  Column_support newColumn;
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  local_98;
  Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
  *local_78;
  anon_class_8_1_d68037b6 local_70;
  anon_class_16_2_633bb64e local_68;
  anon_class_16_2_90bf7f7f local_58;
  anon_class_24_3_e26cf068 local_48;
  
  if (*val == 0) {
    puVar2 = *(undefined8 **)(this + 8);
    for (puVar8 = *(undefined8 **)this; puVar8 != puVar2; puVar8 = puVar8 + 1) {
      if ((void *)*puVar8 != (void *)0x0) {
        operator_delete((void *)*puVar8,8);
      }
    }
    if (*(long *)(this + 8) != *(long *)this) {
      *(long *)(this + 8) = *(long *)this;
    }
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)(this + 0x18));
  }
  if (*(long *)this == *(long *)(this + 8)) {
    std::
    vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
    ::resize((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
              *)this,((long)(column->column_).
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(column->column_).
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) -
                     (column->erasedValues_)._M_h._M_element_count);
    ppEVar10 = (column->column_).
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppEVar3 = (column->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_78 = column;
    if (ppEVar10 != ppEVar3) {
      uVar9 = 0;
      do {
        pEVar5 = *ppEVar10;
        IVar1 = pEVar5->rowIndex_;
        puVar7 = (undefined4 *)operator_new(8);
        *puVar7 = 0;
        puVar7[1] = IVar1;
        *(undefined4 **)(*(long *)this + (ulong)uVar9 * 8) = puVar7;
        **(uint **)(*(long *)this + (ulong)uVar9 * 8) =
             (pEVar5->super_Entry_field_element_option).element_;
        ppEVar10 = ppEVar10 + 1;
        uVar9 = uVar9 + 1;
      } while (ppEVar10 != ppEVar3);
    }
    bVar6 = true;
    if (local_78 !=
        (Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
         *)this) {
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)(this + 0x18),&(local_78->erasedValues_)._M_h);
    }
  }
  else {
    local_98.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
    ::reserve(&local_98,
              ((*(long *)(this + 8) - *(long *)this >> 3) -
              (column->erasedValues_)._M_h._M_element_count) +
              ((long)(column->column_).
                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(column->column_).
                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    local_70.newColumn = &local_98;
    local_68.this =
         (Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
          *)this;
    local_68.val = val;
    local_58.newColumn = &local_98;
    local_58.this =
         (Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
          *)this;
    local_48.this =
         (Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
          *)this;
    local_48.val = val;
    local_48.newColumn = &local_98;
    bVar6 = _generic_add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>,Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>::_multiply_target_and_add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>>(unsigned_int_const&,Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>*)_1_,Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>::_multiply_target_and_add<Gudhi::persistence_____matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>*)_2_>
                      (this,column,&local_48,&local_58,&local_68,&local_70);
    ppEVar10 = *(pointer *)this;
    ppEVar3 = *(pointer *)(this + 8);
    ppEVar4 = *(pointer *)(this + 0x10);
    *(pointer *)this =
         local_98.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(this + 8) =
         local_98.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(this + 0x10) =
         local_98.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (ppEVar10 != (pointer)0x0) {
      local_98.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = ppEVar10;
      local_98.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppEVar3;
      local_98.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = ppEVar4;
      operator_delete(ppEVar10,(long)ppEVar4 - (long)ppEVar10);
    }
  }
  return bVar6;
}

Assistant:

inline bool Vector_column<Master_matrix>::_multiply_target_and_add(const Field_element& val, const Entry_range& column)
{
  if (val == 0u) {
    if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
      throw std::invalid_argument("A chain column should not be multiplied by 0.");
      // this would not only mess up the base, but also the pivots stored.
    } else {
      clear();
    }
  }
  if (column_.empty()) {  // chain should never enter here.
    column_.resize(column.size());
    Index i = 0;
    for (const Entry& entry : column) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        _update_entry(entry.get_row_index(), i++);
      } else {
        _update_entry(entry.get_element(), entry.get_row_index(), i++);
      }
    }
    if constexpr (std::is_same_v<Entry_range, Vector_column<Master_matrix> >) erasedValues_ = column.erasedValues_;
    return true;
  }

  Column_support newColumn;
  newColumn.reserve(column_.size() + column.size());  // safe upper bound

  auto pivotIsZeroed = _generic_add(
      column,
      [&](Entry* entryTarget) {
        operators_->multiply_inplace(entryTarget->get_element(), val);
        if constexpr (Master_matrix::Option_list::has_row_access) RA_opt::update_entry(*entryTarget);
        newColumn.push_back(entryTarget);
      },
      [&](typename Entry_range::const_iterator& itSource, const typename Column_support::iterator& itTarget) {
        _insert_entry(itSource->get_element(), itSource->get_row_index(), newColumn);
      },
      [&](Field_element& targetElement, typename Entry_range::const_iterator& itSource) {
        operators_->multiply_and_add_inplace_front(targetElement, val, itSource->get_element());
      },
      [&](Entry* entryTarget) { newColumn.push_back(entryTarget); }
    );

  column_.swap(newColumn);

  return pivotIsZeroed;
}